

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall
Qentem::Array<Qentem::Value<char16_t>_>::Resize
          (Array<Qentem::Value<char16_t>_> *this,SizeT new_size)

{
  if (new_size != 0) {
    if (new_size < this->index_) {
      Memory::Dispose<Qentem::Value<char16_t>>
                (this->storage_ + new_size,this->storage_ + this->index_);
      this->index_ = new_size;
    }
    resize(this,new_size);
    return;
  }
  Reset(this);
  return;
}

Assistant:

void Resize(SizeT new_size) {
        if (new_size != 0) {
            if (Size() > new_size) {
                // Shrink
                Memory::Dispose((Storage() + new_size), End());
                setSize(new_size);
            }

            resize(new_size);
            return;
        }

        Reset();
    }